

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_split.c
# Opt level: O2

REF_STATUS ref_split_pass(REF_GRID ref_grid)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  REF_INT node0;
  REF_INT node1;
  REF_MPI pRVar4;
  REF_NODE pRVar5;
  REF_INT *pRVar6;
  uint uVar7;
  uint uVar8;
  REF_STATUS RVar9;
  REF_DBL *pRVar10;
  long lVar11;
  REF_INT *__ptr;
  char *pcVar12;
  REF_CELL pRVar13;
  ulong uVar14;
  undefined4 uVar15;
  undefined8 unaff_R13;
  REF_EDGE pRVar16;
  ulong uVar17;
  REF_DBL RVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  double dVar21;
  double dVar22;
  undefined8 uStack_120;
  REF_INT new_node;
  int local_114;
  REF_NODE local_110;
  REF_CAVITY ref_cavity;
  REF_BOOL allowed;
  long local_f8;
  undefined4 local_ec;
  REF_SUBDIV ref_subdiv;
  REF_EDGE ref_edge;
  REF_BOOL has_edge;
  REF_LIST para_cavity;
  REF_LIST para_no_geom;
  double local_c0;
  long local_b8;
  REF_INT *local_b0;
  void *local_a8;
  REF_DBL *local_a0;
  REF_DBL ratio01;
  REF_INT n_cavity;
  REF_BOOL allowed_tri_quality;
  REF_BOOL allowed_cavity_ratio;
  REF_BOOL geom_support;
  REF_BOOL allowed_local;
  REF_BOOL allowed_tet_quality;
  REF_BOOL allowed_tri_conformity;
  REF_BOOL allowed_ratio;
  long local_70;
  REF_MPI local_68;
  REF_CELL local_60;
  REF_DBL ratio1;
  REF_DBL ratio0;
  REF_GLOB global;
  REF_DBL min_add;
  REF_DBL min_del;
  
  pRVar4 = ref_grid->mpi;
  pRVar5 = ref_grid->node;
  ref_cavity = (REF_CAVITY)0x0;
  para_no_geom = (REF_LIST)0x0;
  para_cavity = (REF_LIST)0x0;
  ref_subdiv = (REF_SUBDIV)0x0;
  if ((ref_grid->twod == 0) && (ref_grid->surf == 0)) {
    pRVar13 = ref_grid->cell[8];
    if (pRVar4->n < 2) goto LAB_001415a6;
    uVar7 = ref_list_create(&para_no_geom);
    if (uVar7 != 0) {
      uVar14 = (ulong)uVar7;
      pcVar12 = "list for stuck edges";
      uStack_120 = 0x6d;
      goto LAB_001415db;
    }
    uVar7 = ref_list_create(&para_cavity);
    if (uVar7 != 0) {
      uVar14 = (ulong)uVar7;
      pcVar12 = "list for stuck cavity";
      uStack_120 = 0x6e;
      goto LAB_001415db;
    }
    uVar15 = (undefined4)CONCAT71((int7)((ulong)unaff_R13 >> 8),1);
  }
  else {
    pRVar13 = ref_grid->cell[3];
LAB_001415a6:
    uVar15 = 0;
  }
  uVar7 = ref_edge_create(&ref_edge,ref_grid);
  pRVar16 = ref_edge;
  if (uVar7 != 0) {
    uVar14 = (ulong)uVar7;
    pcVar12 = "orig edges";
    uStack_120 = 0x71;
LAB_001415db:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c",
           uStack_120,"ref_split_pass",uVar14,pcVar12);
    return (REF_STATUS)uVar14;
  }
  uVar14 = (ulong)ref_edge->n;
  local_ec = uVar15;
  local_60 = pRVar13;
  if ((long)uVar14 < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c",0x73,
           "ref_split_pass","malloc ratio of REF_DBL negative");
    return 1;
  }
  pRVar10 = (REF_DBL *)malloc(uVar14 * 8);
  if (pRVar10 == (REF_DBL *)0x0) {
    pcVar12 = "malloc ratio of REF_DBL NULL";
    uStack_120 = 0x73;
  }
  else {
    local_a0 = pRVar10;
    local_b0 = (REF_INT *)malloc(uVar14 * 4);
    if (local_b0 == (REF_INT *)0x0) {
      pcVar12 = "malloc order of REF_INT NULL";
      uStack_120 = 0x74;
    }
    else {
      local_a8 = malloc(uVar14 * 4);
      if (local_a8 != (void *)0x0) {
        uVar7 = 0;
        local_110 = pRVar5;
        local_68 = pRVar4;
        for (lVar11 = 0; __ptr = local_b0, lVar11 < (int)uVar14; lVar11 = lVar11 + 1) {
          pRVar10 = local_a0 + (int)uVar7;
          uVar8 = ref_node_ratio(local_110,pRVar16->e2n[lVar11 * 2],pRVar16->e2n[lVar11 * 2 + 1],
                                 pRVar10);
          if (uVar8 != 0) {
            uVar14 = (ulong)uVar8;
            pcVar12 = "ratio";
            uStack_120 = 0x7b;
            goto LAB_001415db;
          }
          dVar21 = *pRVar10;
          pRVar10 = &ref_grid->adapt->split_ratio;
          if (*pRVar10 <= dVar21 && dVar21 != *pRVar10) {
            *(int *)((long)local_a8 + (long)(int)uVar7 * 4) = (int)lVar11;
            uVar7 = uVar7 + 1;
          }
          uVar14 = (ulong)(uint)ref_edge->n;
          pRVar16 = ref_edge;
        }
        uVar8 = ref_sort_heap_dbl(uVar7,local_a0,local_b0);
        if (uVar8 == 0) {
          for (uVar17 = (ulong)uVar7; uVar15 = local_ec, 0 < (int)uVar17; uVar17 = uVar17 - 1) {
            iVar2 = *(int *)((long)local_a8 + (long)__ptr[uVar17 - 1] * 4);
            lVar11 = (long)iVar2;
            local_114 = ref_edge->e2n[lVar11 * 2];
            iVar2 = ref_edge->e2n[iVar2 * 2 + 1];
            uVar7 = ref_cell_has_side(local_60,local_114,iVar2,&allowed);
            if (uVar7 != 0) {
              uVar14 = (ulong)uVar7;
              pcVar12 = "has side";
              uStack_120 = 0x8c;
              goto LAB_001415db;
            }
            local_70 = lVar11;
            if (allowed != 0) {
              local_b8 = (long)local_114;
              iVar3 = local_110->ref_mpi->id;
              if ((iVar3 == local_110->part[local_b8]) || (iVar3 == local_110->part[iVar2])) {
                local_f8 = (long)iVar2;
                uVar7 = ref_split_edge_mixed(ref_grid,local_114,iVar2,&allowed);
                pRVar5 = local_110;
                iVar3 = local_114;
                if (uVar7 != 0) {
                  uVar14 = (ulong)uVar7;
                  pcVar12 = "mixed";
                  uStack_120 = 0x96;
                  goto LAB_001415db;
                }
                if (allowed != 0) {
                  if ((ref_grid->twod != 0) || (dVar21 = 0.5, ref_grid->surf != 0)) {
                    uVar7 = ref_node_ratio(local_110,local_114,iVar2,&ratio01);
                    if (uVar7 != 0) {
                      uVar14 = (ulong)uVar7;
                      pcVar12 = "ratio01";
                      uStack_120 = 0x9c;
                      goto LAB_001415db;
                    }
                    uVar7 = ref_node_ratio_node0(pRVar5,iVar3,(REF_INT)local_f8,&ratio0);
                    if (uVar7 != 0) {
                      uVar14 = (ulong)uVar7;
                      pcVar12 = "ratio0";
                      uStack_120 = 0x9d;
                      goto LAB_001415db;
                    }
                    uVar7 = ref_node_ratio_node0(pRVar5,iVar2,iVar3,&ratio1);
                    if (uVar7 != 0) {
                      uVar14 = (ulong)uVar7;
                      pcVar12 = "ratio1";
                      uStack_120 = 0x9e;
                      goto LAB_001415db;
                    }
                    auVar19._0_8_ = ratio1 * 1e+20 + ratio0;
                    auVar19._8_8_ = ratio0;
                    auVar20._8_8_ = -ratio0;
                    auVar20._0_8_ = -auVar19._0_8_;
                    auVar20 = maxpd(auVar19,auVar20);
                    dVar21 = 0.5;
                    if (auVar20._8_8_ < auVar20._0_8_) {
                      dVar21 = ratio0 / (ratio1 + ratio0);
                      if ((dVar21 <= 0.25) || (0.75 <= dVar21)) {
                        dVar22 = ratio01 * 1e+20;
                        if (dVar22 <= -dVar22) {
                          dVar22 = -dVar22;
                        }
                        if (ratio1 <= ratio0) {
                          RVar18 = ratio1;
                          if (ratio1 <= -ratio1) {
                            RVar18 = -ratio1;
                          }
                          dVar21 = 0.5;
                          if (RVar18 < dVar22) {
                            dVar21 = ratio1 / ratio01;
                          }
                        }
                        else {
                          dVar21 = 0.5;
                          if (auVar20._8_8_ < dVar22) {
                            dVar21 = 1.0 - ratio0 / ratio01;
                          }
                        }
                      }
                      else {
                        dVar21 = 1.0 - dVar21;
                      }
                    }
                  }
                  pRVar5 = local_110;
                  local_c0 = dVar21;
                  uVar7 = ref_node_next_global(local_110,&global);
                  if (uVar7 != 0) {
                    uVar14 = (ulong)uVar7;
                    pcVar12 = "next global";
                    uStack_120 = 0xb1;
                    goto LAB_001415db;
                  }
                  uVar7 = ref_node_add(pRVar5,global,&new_node);
                  iVar3 = local_114;
                  if (uVar7 != 0) {
                    uVar14 = (ulong)uVar7;
                    pcVar12 = "new node";
                    uStack_120 = 0xb2;
                    goto LAB_001415db;
                  }
                  dVar21 = 0.05;
                  if (0.05 <= local_c0) {
                    dVar21 = local_c0;
                  }
                  local_c0 = 0.95;
                  if (dVar21 <= 0.95) {
                    local_c0 = dVar21;
                  }
                  uVar7 = ref_node_interpolate_edge
                                    (pRVar5,local_114,(REF_INT)local_f8,local_c0,new_node);
                  if (uVar7 != 0) {
                    uVar14 = (ulong)uVar7;
                    pcVar12 = "interp new node";
                    uStack_120 = 0xb5;
                    goto LAB_001415db;
                  }
                  uVar7 = ref_geom_add_between(ref_grid,iVar3,iVar2,local_c0,new_node);
                  if (uVar7 != 0) {
                    uVar14 = (ulong)uVar7;
                    pcVar12 = "geom new node";
                    uStack_120 = 0xb7;
                    goto LAB_001415db;
                  }
                  uVar7 = ref_geom_constrain(ref_grid,new_node);
                  if (uVar7 != 0) {
                    uVar14 = (ulong)uVar7;
                    pcVar12 = "geom constraint";
                    uStack_120 = 0xb8;
                    goto LAB_001415db;
                  }
                  uVar7 = ref_metric_interpolate_between
                                    (ref_grid,local_114,(REF_INT)local_f8,new_node);
                  if (uVar7 != 0) {
                    uVar14 = (ulong)uVar7;
                    pcVar12 = "interp new node metric";
                    uStack_120 = 0xba;
                    goto LAB_001415db;
                  }
                  uVar7 = ref_geom_supported(ref_grid->geom,new_node,&geom_support);
                  iVar3 = local_114;
                  if (uVar7 != 0) {
                    uVar14 = (ulong)uVar7;
                    pcVar12 = "geom support";
                    uStack_120 = 0xbc;
                    goto LAB_001415db;
                  }
                  uVar7 = ref_split_edge_tet_quality
                                    (ref_grid,local_114,iVar2,new_node,&allowed_tet_quality);
                  if (uVar7 != 0) {
                    uVar14 = (ulong)uVar7;
                    pcVar12 = "edge tet qual";
                    uStack_120 = 0xdf;
                    goto LAB_001415db;
                  }
                  uVar7 = ref_split_edge_tri_quality
                                    (ref_grid,iVar3,(REF_INT)local_f8,new_node,&allowed_tri_quality)
                  ;
                  if (uVar7 != 0) {
                    uVar14 = (ulong)uVar7;
                    pcVar12 = "quality of new tri";
                    uStack_120 = 0xe4;
                    goto LAB_001415db;
                  }
                  uVar7 = ref_split_edge_ratio(ref_grid,iVar3,iVar2,new_node,&allowed_ratio);
                  if (uVar7 != 0) {
                    uVar14 = (ulong)uVar7;
                    pcVar12 = "edge tet ratio";
                    uStack_120 = 0xe8;
                    goto LAB_001415db;
                  }
                  uVar7 = ref_split_edge_tri_conformity
                                    (0,ref_grid,iVar3,(REF_INT)local_f8,new_node,
                                     &allowed_tri_conformity);
                  if (uVar7 != 0) {
                    uVar14 = (ulong)uVar7;
                    pcVar12 = "edge tri qual";
                    uStack_120 = 0xed;
                    goto LAB_001415db;
                  }
                  uVar7 = ref_cell_has_side(ref_grid->cell[0],iVar3,iVar2,&has_edge);
                  __ptr = local_b0;
                  if (uVar7 != 0) {
                    uVar14 = (ulong)uVar7;
                    pcVar12 = "check for an edge";
                    uStack_120 = 0xf1;
                    goto LAB_001415db;
                  }
                  if ((((allowed_tet_quality == 0) || (allowed_ratio == 0)) ||
                      (allowed_tri_conformity == 0)) || (allowed_tri_quality == 0)) {
                    if (geom_support == 0) {
                      uVar7 = ref_node_remove(local_110,new_node);
                      if (uVar7 != 0) {
                        uVar14 = (ulong)uVar7;
                        pcVar12 = "remove new node";
                        uStack_120 = 0xfa;
                        goto LAB_001415db;
                      }
                      uVar7 = ref_geom_remove_all(ref_grid->geom,new_node);
                      if (uVar7 != 0) {
                        uVar14 = (ulong)uVar7;
                        pcVar12 = "rm";
                        uStack_120 = 0xfb;
                        goto LAB_001415db;
                      }
                    }
                    else {
                      uVar7 = ref_cavity_create(&ref_cavity);
                      if (uVar7 != 0) {
                        uVar14 = (ulong)uVar7;
                        pcVar12 = "cav create";
                        uStack_120 = 0x101;
                        goto LAB_001415db;
                      }
                      ref_cavity->debug = 0;
                      if ((ref_grid->surf != 0) && (has_edge != 0)) {
                        uVar7 = ref_node_ratio(local_110,local_114,(REF_INT)local_f8,&ratio01);
                        if (uVar7 != 0) {
                          uVar14 = (ulong)uVar7;
                          pcVar12 = "ratio01";
                          uStack_120 = 0x104;
                          goto LAB_001415db;
                        }
                        if (5.0 < ratio01) {
                          ref_cavity->min_normdev = 0.0;
                        }
                      }
                      uVar7 = ref_cavity_form_edge_split
                                        (ref_cavity,ref_grid,local_114,iVar2,new_node);
                      if (uVar7 != 0) {
                        uVar14 = (ulong)uVar7;
                        pcVar12 = "form edge split cav";
                        uStack_120 = 0x109;
                        goto LAB_001415db;
                      }
                      RVar9 = ref_cavity_enlarge_combined(ref_cavity);
                      if (RVar9 != 0) {
                        uVar7 = ref_grid_tattle(ref_grid,local_114);
                        if (uVar7 != 0) {
                          uVar14 = (ulong)uVar7;
                          pcVar12 = "tattle node0";
                          uStack_120 = 0x112;
                          goto LAB_001415db;
                        }
                        uVar7 = ref_grid_tattle(ref_grid,(REF_INT)local_f8);
                        if (uVar7 != 0) {
                          uVar14 = (ulong)uVar7;
                          pcVar12 = "tattle node1";
                          uStack_120 = 0x113;
                          goto LAB_001415db;
                        }
                        printf("%s: %d: %s: %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                               ,0x114,"ref_split_pass","enlarge");
                      }
                      if (ref_cavity->state == REF_CAVITY_VISIBLE) {
                        uVar7 = ref_cavity_ratio(ref_cavity,&allowed_cavity_ratio);
                        if (uVar7 != 0) {
                          uVar14 = (ulong)uVar7;
                          pcVar12 = "cavity ratio";
                          uStack_120 = 0x119;
                          goto LAB_001415db;
                        }
                        uVar7 = ref_cavity_change(ref_cavity,&min_del,&min_add);
                        if (uVar7 != 0) {
                          uVar14 = (ulong)uVar7;
                          pcVar12 = "cavity change";
                          uStack_120 = 0x11a;
                          goto LAB_001415db;
                        }
                        if ((has_edge != 0 || allowed_cavity_ratio != 0) &&
                           (pRVar10 = &ref_grid->adapt->split_quality_absolute,
                           *pRVar10 <= min_add && min_add != *pRVar10)) {
                          uVar7 = ref_cavity_replace(ref_cavity);
                          if (uVar7 == 0) {
                            uVar7 = ref_cavity_free(ref_cavity);
                            if (uVar7 == 0) {
                              ref_cavity = (REF_CAVITY)0x0;
                              pRVar6 = local_110->age;
                              pRVar6[local_b8] = 0;
                              pRVar6[local_f8] = 0;
                              uVar7 = ref_smooth_post_edge_split(ref_grid,new_node);
                              if (uVar7 == 0) goto LAB_0014201f;
                              uVar14 = (ulong)uVar7;
                              pcVar12 = "smooth after split";
                              uStack_120 = 300;
                            }
                            else {
                              uVar14 = (ulong)uVar7;
                              pcVar12 = "cav free";
                              uStack_120 = 0x127;
                            }
                          }
                          else {
                            uVar14 = (ulong)uVar7;
                            pcVar12 = "cav replace";
                            uStack_120 = 0x126;
                          }
                          goto LAB_001415db;
                        }
                      }
                      if (((char)local_ec == '\x01' &&
                           ref_cavity->state == REF_CAVITY_PARTITION_CONSTRAINED) &&
                         (uVar7 = ref_list_push(para_cavity,(REF_INT)local_70), uVar7 != 0)) {
                        uVar14 = (ulong)uVar7;
                        pcVar12 = "push";
                        uStack_120 = 0x137;
                        goto LAB_001415db;
                      }
                      uVar7 = ref_cavity_free(ref_cavity);
                      if (uVar7 != 0) {
                        uVar14 = (ulong)uVar7;
                        pcVar12 = "cav free";
                        uStack_120 = 0x139;
                        goto LAB_001415db;
                      }
                      ref_cavity = (REF_CAVITY)0x0;
                      uVar7 = ref_node_remove(local_110,new_node);
                      if (uVar7 != 0) {
                        uVar14 = (ulong)uVar7;
                        pcVar12 = "remove new node";
                        uStack_120 = 0x13b;
                        goto LAB_001415db;
                      }
                      uVar7 = ref_geom_remove_all(ref_grid->geom,new_node);
                      if (uVar7 != 0) {
                        uVar14 = (ulong)uVar7;
                        pcVar12 = "rm";
                        uStack_120 = 0x13c;
                        goto LAB_001415db;
                      }
                    }
                  }
                  else {
                    uVar7 = ref_cell_local_gem(local_60,local_110,local_114,iVar2,&allowed_local);
                    __ptr = local_b0;
                    lVar11 = local_f8;
                    if (uVar7 != 0) {
                      uVar14 = (ulong)uVar7;
                      pcVar12 = "local tet";
                      uStack_120 = 0x141;
                      goto LAB_001415db;
                    }
                    if (allowed_local == 0) {
                      if ((char)local_ec == '\0') {
                        pRVar6 = local_110->age;
                        piVar1 = pRVar6 + local_b8;
                        *piVar1 = *piVar1 + 1;
                        piVar1 = pRVar6 + local_f8;
                        *piVar1 = *piVar1 + 1;
                      }
                      else {
                        uVar7 = ref_list_push(para_no_geom,(REF_INT)local_70);
                        if (uVar7 != 0) {
                          uVar14 = (ulong)uVar7;
                          pcVar12 = "push";
                          uStack_120 = 0x144;
                          goto LAB_001415db;
                        }
                      }
                      uVar7 = ref_node_remove(local_110,new_node);
                      if (uVar7 != 0) {
                        uVar14 = (ulong)uVar7;
                        pcVar12 = "remove new node";
                        uStack_120 = 0x149;
                        goto LAB_001415db;
                      }
                      uVar7 = ref_geom_remove_all(ref_grid->geom,new_node);
                      if (uVar7 != 0) {
                        uVar14 = (ulong)uVar7;
                        pcVar12 = "rm";
                        uStack_120 = 0x14a;
                        goto LAB_001415db;
                      }
                    }
                    else {
                      uVar7 = ref_split_edge(ref_grid,local_114,(REF_INT)local_f8,new_node);
                      if (uVar7 == 0) {
                        pRVar6 = local_110->age;
                        pRVar6[local_b8] = 0;
                        pRVar6[lVar11] = 0;
                        uVar7 = ref_smooth_post_edge_split(ref_grid,new_node);
                        if (uVar7 != 0) {
                          uVar14 = (ulong)uVar7;
                          pcVar12 = "smooth after split";
                          uStack_120 = 0x15d;
                          goto LAB_001415db;
                        }
                      }
                      else {
                        uVar14 = (ulong)uVar7;
                        if (uVar7 != 7) {
                          pcVar12 = "tet edge split";
                          uStack_120 = 0x155;
                          goto LAB_001415db;
                        }
                        uVar7 = ref_node_remove(local_110,new_node);
                        if (uVar7 != 0) {
                          uVar14 = (ulong)uVar7;
                          pcVar12 = "remove new node";
                          uStack_120 = 0x151;
                          goto LAB_001415db;
                        }
                        uVar7 = ref_geom_remove_all(ref_grid->geom,new_node);
                        if (uVar7 != 0) {
                          uVar14 = (ulong)uVar7;
                          pcVar12 = "rm";
                          uStack_120 = 0x152;
                          goto LAB_001415db;
                        }
                      }
                    }
                  }
                }
              }
            }
LAB_0014201f:
          }
          free(local_a8);
          free(__ptr);
          free(local_a0);
          if ((char)uVar15 == '\0') {
LAB_001428e7:
            ref_edge_free(ref_edge);
            return 0;
          }
          if (0 < ref_grid->adapt->timing_level) {
            ref_mpi_stopwatch_stop(ref_grid->mpi,"spl int");
          }
          uVar7 = ref_subdiv_create(&ref_subdiv,ref_grid);
          if (uVar7 == 0) {
            ref_subdiv->new_mark_allowed = 0;
            ref_subdiv->instrument = 1;
            for (lVar11 = 0; lVar11 < para_no_geom->n; lVar11 = lVar11 + 1) {
              node0 = ref_edge->e2n[(long)para_no_geom->value[lVar11] * 2];
              node1 = ref_edge->e2n[para_no_geom->value[lVar11] * 2 + 1];
              uVar7 = ref_cell_has_side(ref_grid->cell[8],node0,node1,&allowed);
              if (uVar7 != 0) {
                uVar14 = (ulong)uVar7;
                pcVar12 = "has side";
                uStack_120 = 0x16f;
                goto LAB_001415db;
              }
              if ((allowed != 0) &&
                 (uVar7 = ref_subdiv_mark_to_split(ref_subdiv,node0,node1), uVar7 != 0)) {
                uVar14 = (ulong)uVar7;
                pcVar12 = "mark edge to para split";
                uStack_120 = 0x173;
                goto LAB_001415db;
              }
            }
            uVar7 = ref_subdiv_split(ref_subdiv);
            if (uVar7 == 0) {
              uVar7 = ref_subdiv_free(ref_subdiv);
              if (uVar7 == 0) {
                n_cavity = para_cavity->n;
                uVar7 = ref_mpi_allsum(local_68,&n_cavity,1,1);
                if (uVar7 == 0) {
                  if (local_68->id == 0) {
                    printf("cavities with part constraints %d\n",(ulong)(uint)n_cavity);
                  }
                  ref_list_free(para_no_geom);
                  ref_list_free(para_cavity);
                  goto LAB_001428e7;
                }
                uVar14 = (ulong)uVar7;
                pcVar12 = "cavs";
                uStack_120 = 0x17c;
              }
              else {
                uVar14 = (ulong)uVar7;
                pcVar12 = "free";
                uStack_120 = 0x177;
              }
            }
            else {
              uVar14 = (ulong)uVar7;
              pcVar12 = "split";
              uStack_120 = 0x176;
            }
          }
          else {
            uVar14 = (ulong)uVar7;
            pcVar12 = "create";
            uStack_120 = 0x167;
          }
        }
        else {
          uVar14 = (ulong)uVar8;
          pcVar12 = "sort lengths";
          uStack_120 = 0x82;
        }
        goto LAB_001415db;
      }
      pcVar12 = "malloc edges of REF_INT NULL";
      uStack_120 = 0x75;
      local_a8 = (void *)0x0;
    }
  }
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c",
         uStack_120,"ref_split_pass",pcVar12);
  return 2;
}

Assistant:

REF_FCN REF_STATUS ref_split_pass(REF_GRID ref_grid) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_tet(ref_grid);
  REF_EDGE ref_edge;
  REF_DBL *ratio;
  REF_INT *edges, *order;
  REF_INT i, n, edge;
  REF_BOOL allowed_ratio, allowed_tri_conformity, allowed_tet_quality;
  REF_BOOL allowed, allowed_local, geom_support, valid_cavity, try_cavity;
  REF_BOOL allowed_cavity_ratio, has_edge;
  REF_BOOL allowed_tri_quality;
  REF_DBL min_del, min_add;
  REF_GLOB global;
  REF_INT node0, node1;
  REF_INT new_node;
  REF_CAVITY ref_cavity = (REF_CAVITY)NULL;
  REF_BOOL span_parts;
  REF_LIST para_no_geom = NULL;
  REF_LIST para_cavity = NULL;
  REF_SUBDIV ref_subdiv = NULL;
  REF_STATUS status;
  REF_BOOL transcript = REF_FALSE;
  REF_DBL ratio01, ratio0, ratio1, weight_node1;

  ref_cell = ref_grid_tet(ref_grid);
  if (ref_grid_twod(ref_grid) || ref_grid_surf(ref_grid))
    ref_cell = ref_grid_tri(ref_grid);

  span_parts = ref_mpi_para(ref_grid_mpi(ref_grid)) &&
               !ref_grid_twod(ref_grid) && !ref_grid_surf(ref_grid);

  if (span_parts) {
    RSS(ref_list_create(&para_no_geom), "list for stuck edges");
    RSS(ref_list_create(&para_cavity), "list for stuck cavity");
  }

  RSS(ref_edge_create(&ref_edge, ref_grid), "orig edges");

  ref_malloc(ratio, ref_edge_n(ref_edge), REF_DBL);
  ref_malloc(order, ref_edge_n(ref_edge), REF_INT);
  ref_malloc(edges, ref_edge_n(ref_edge), REF_INT);

  n = 0;
  for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
    node0 = ref_edge_e2n(ref_edge, 0, edge);
    node1 = ref_edge_e2n(ref_edge, 1, edge);
    RSS(ref_node_ratio(ref_node, node0, node1, &(ratio[n])), "ratio");
    if (ratio[n] > ref_grid_adapt(ref_grid, split_ratio)) {
      edges[n] = edge;
      n++;
    }
  }

  RSS(ref_sort_heap_dbl(n, ratio, order), "sort lengths");

  for (i = n - 1; i >= 0; i--) {
    edge = edges[order[i]];
    node0 = ref_edge_e2n(ref_edge, 0, edge);
    node1 = ref_edge_e2n(ref_edge, 1, edge);

    /* transcript = (ratio[order[i]] > 3.0); */
    if (transcript) printf("transcript on ratio %f\n", ratio[order[i]]);

    RSS(ref_cell_has_side(ref_cell, node0, node1, &allowed), "has side");
    if (transcript && !allowed) printf("not a side anymore\n");
    if (!allowed) continue;

    /* skip if neither node is owned */
    if (!ref_node_owned(ref_node, node0) && !ref_node_owned(ref_node, node1)) {
      if (transcript) printf("neither node is local\n");
      continue;
    }

    RSS(ref_split_edge_mixed(ref_grid, node0, node1, &allowed), "mixed");
    if (transcript && !allowed) printf("mixed edge\n");
    if (!allowed) continue;

    weight_node1 = 0.5;
    if (ref_grid_twod(ref_grid) || ref_grid_surf(ref_grid)) {
      RSS(ref_node_ratio(ref_node, node0, node1, &ratio01), "ratio01");
      RSS(ref_node_ratio_node0(ref_node, node0, node1, &ratio0), "ratio0");
      RSS(ref_node_ratio_node0(ref_node, node1, node0, &ratio1), "ratio1");
      if (ref_math_divisible(ratio0, ratio1 + ratio0)) {
        if (0.25 < ratio0 / (ratio0 + ratio1) &&
            ratio0 / (ratio0 + ratio1) < 0.75) {
          weight_node1 = 1.0 - ratio0 / (ratio0 + ratio1);
        } else {
          if (ratio0 < ratio1) {
            if (ref_math_divisible(ratio0, ratio01))
              weight_node1 = 1.0 - ratio0 / ratio01;
          } else {
            if (ref_math_divisible(ratio1, ratio01))
              weight_node1 = ratio1 / ratio01;
          }
        }
      }
    }
    weight_node1 = MIN(0.95, MAX(0.05, weight_node1));
    if (transcript) printf("weight_node1 %f\n", weight_node1);

    RSS(ref_node_next_global(ref_node, &global), "next global");
    RSS(ref_node_add(ref_node, global, &new_node), "new node");
    RSS(ref_node_interpolate_edge(ref_node, node0, node1, weight_node1,
                                  new_node),
        "interp new node");
    RSS(ref_geom_add_between(ref_grid, node0, node1, weight_node1, new_node),
        "geom new node");
    RSS(ref_geom_constrain(ref_grid, new_node), "geom constraint");
    RSS(ref_metric_interpolate_between(ref_grid, node0, node1, new_node),
        "interp new node metric");
    RSS(ref_geom_supported(ref_grid_geom(ref_grid), new_node, &geom_support),
        "geom support");
    if (transcript && geom_support) printf("geom support\n");

    if (transcript) {
      REF_DBL d0, d1;
      d0 = sqrt(pow(ref_node_xyz(ref_node, 0, node0) -
                        ref_node_xyz(ref_node, 0, new_node),
                    2) +
                pow(ref_node_xyz(ref_node, 1, node0) -
                        ref_node_xyz(ref_node, 1, new_node),
                    2) +
                pow(ref_node_xyz(ref_node, 2, node0) -
                        ref_node_xyz(ref_node, 2, new_node),
                    2));
      d1 = sqrt(pow(ref_node_xyz(ref_node, 0, node1) -
                        ref_node_xyz(ref_node, 0, new_node),
                    2) +
                pow(ref_node_xyz(ref_node, 1, node1) -
                        ref_node_xyz(ref_node, 1, new_node),
                    2) +
                pow(ref_node_xyz(ref_node, 2, node1) -
                        ref_node_xyz(ref_node, 2, new_node),
                    2));
      printf("w1 %f xyz %f %f %f d %f %f\nbetween %f %f %f %f %f %f\n",
             weight_node1, ref_node_xyz(ref_node, 0, new_node),
             ref_node_xyz(ref_node, 1, new_node),
             ref_node_xyz(ref_node, 2, new_node), d0, d1,
             ref_node_xyz(ref_node, 0, node0), ref_node_xyz(ref_node, 1, node0),
             ref_node_xyz(ref_node, 2, node0), ref_node_xyz(ref_node, 0, node1),
             ref_node_xyz(ref_node, 1, node1),
             ref_node_xyz(ref_node, 2, node1));
    }

    RSS(ref_split_edge_tet_quality(ref_grid, node0, node1, new_node,
                                   &allowed_tet_quality),
        "edge tet qual");
    if (transcript && !allowed_tet_quality) printf("tet quality poor\n");

    RSS(ref_split_edge_tri_quality(ref_grid, node0, node1, new_node,
                                   &allowed_tri_quality),
        "quality of new tri");
    if (transcript && !allowed_tri_quality) printf("tri quality poor\n");

    RSS(ref_split_edge_ratio(ref_grid, node0, node1, new_node, &allowed_ratio),
        "edge tet ratio");
    if (transcript && !allowed_ratio) printf("ratio poor\n");

    RSS(ref_split_edge_tri_conformity(transcript, ref_grid, node0, node1,
                                      new_node, &allowed_tri_conformity),
        "edge tri qual");
    if (transcript && !allowed_tri_conformity) printf("tri conformity poor\n");

    RSS(ref_cell_has_side(ref_grid_edg(ref_grid), node0, node1, &has_edge),
        "check for an edge");
    if (transcript && has_edge) printf("has geom edge\n");

    try_cavity = REF_FALSE;
    if (!allowed_tet_quality || !allowed_ratio || !allowed_tri_conformity ||
        !allowed_tri_quality) {
      if (geom_support) {
        try_cavity = REF_TRUE;
      } else {
        RSS(ref_node_remove(ref_node, new_node), "remove new node");
        RSS(ref_geom_remove_all(ref_grid_geom(ref_grid), new_node), "rm");
        continue;
      }
    }

    if (try_cavity) {
      RSS(ref_cavity_create(&ref_cavity), "cav create");
      ref_cavity_debug(ref_cavity) = transcript;
      if (ref_grid_surf(ref_grid) && has_edge) {
        RSS(ref_node_ratio(ref_node, node0, node1, &ratio01), "ratio01");
        if (ratio01 > 5.0) ref_cavity_min_normdev(ref_cavity) = 0.0;
      }
      RSS(ref_cavity_form_edge_split(ref_cavity, ref_grid, node0, node1,
                                     new_node),
          "form edge split cav");
      if (transcript) {
        REF_BOOL normdev_improved;
        RSS(ref_cavity_normdev(ref_cavity, &normdev_improved), "nd");
        printf("form cavity status %d min normdev %f\n",
               (int)ref_cavity_state(ref_cavity),
               ref_cavity_min_normdev(ref_cavity));
      }
      if (REF_SUCCESS != ref_cavity_enlarge_combined(ref_cavity)) {
        RSS(ref_grid_tattle(ref_grid, node0), "tattle node0");
        RSS(ref_grid_tattle(ref_grid, node1), "tattle node1");
        REF_WHERE("enlarge"); /* note but skip cavity failures */
      }
      if (REF_CAVITY_VISIBLE == ref_cavity_state(ref_cavity)) {
        if (transcript) printf("cavity visible\n");
        RSS(ref_cavity_ratio(ref_cavity, &allowed_cavity_ratio),
            "cavity ratio");
        RSS(ref_cavity_change(ref_cavity, &min_del, &min_add), "cavity change");
        valid_cavity =
            (allowed_cavity_ratio || has_edge) &&
            (min_add > ref_grid_adapt(ref_grid, split_quality_absolute));
        if (transcript && !valid_cavity)
          printf("valid_cavity edge %d ratio %d add %d %f\n", has_edge,
                 allowed_cavity_ratio,
                 (min_add > ref_grid_adapt(ref_grid, split_quality_absolute)),
                 min_add);

        if (valid_cavity) {
          if (transcript) printf("cavity replace\n");
          RSS(ref_cavity_replace(ref_cavity), "cav replace");
          RSS(ref_cavity_free(ref_cavity), "cav free");
          ref_cavity = (REF_CAVITY)NULL;
          ref_node_age(ref_node, node0) = 0;
          ref_node_age(ref_node, node1) = 0;
          RSS(ref_smooth_post_edge_split(ref_grid, new_node),
              "smooth after split");
          continue;
        }
      } else {
        if (transcript) {
          REF_BOOL normdev_improved;
          RSS(ref_cavity_normdev(ref_cavity, &normdev_improved), "nd");
          printf("cavity not visible %d\n", (int)ref_cavity_state(ref_cavity));
        }
      }
      if (REF_CAVITY_PARTITION_CONSTRAINED == ref_cavity_state(ref_cavity)) {
        if (span_parts) RSS(ref_list_push(para_cavity, edge), "push");
      }
      RSS(ref_cavity_free(ref_cavity), "cav free");
      ref_cavity = (REF_CAVITY)NULL;
      RSS(ref_node_remove(ref_node, new_node), "remove new node");
      RSS(ref_geom_remove_all(ref_grid_geom(ref_grid), new_node), "rm");
      continue;
    }

    RSS(ref_cell_local_gem(ref_cell, ref_node, node0, node1, &allowed_local),
        "local tet");
    if (!allowed_local) {
      if (span_parts) {
        RSS(ref_list_push(para_no_geom, edge), "push");
      } else {
        ref_node_age(ref_node, node0)++;
        ref_node_age(ref_node, node1)++;
      }
      RSS(ref_node_remove(ref_node, new_node), "remove new node");
      RSS(ref_geom_remove_all(ref_grid_geom(ref_grid), new_node), "rm");
      continue;
    }

    if (transcript) printf("split\n");
    status = ref_split_edge(ref_grid, node0, node1, new_node);
    if (REF_INCREASE_LIMIT == status) {
      RSS(ref_node_remove(ref_node, new_node), "remove new node");
      RSS(ref_geom_remove_all(ref_grid_geom(ref_grid), new_node), "rm");
      continue;
    }
    RSS(status, "tet edge split");

    if (transcript)
      RSS(ref_split_edge_ratio_post_report(ref_grid, node0, node1, new_node),
          "report ratio");
    ref_node_age(ref_node, node0) = 0;
    ref_node_age(ref_node, node1) = 0;

    RSS(ref_smooth_post_edge_split(ref_grid, new_node), "smooth after split");
  }

  ref_free(edges);
  ref_free(order);
  ref_free(ratio);

  if (span_parts) {
    if (ref_grid_adapt(ref_grid, timing_level) > 0)
      ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "spl int");
    RSS(ref_subdiv_create(&ref_subdiv, ref_grid), "create");
    ref_subdiv_new_mark_allowed(ref_subdiv) = REF_FALSE;
    ref_subdiv->instrument = REF_TRUE;
    each_ref_list_item(para_no_geom, i) {
      edge = ref_list_value(para_no_geom, i);
      node0 = ref_edge_e2n(ref_edge, 0, edge);
      node1 = ref_edge_e2n(ref_edge, 1, edge);
      RSS(ref_cell_has_side(ref_grid_tet(ref_grid), node0, node1, &allowed),
          "has side");
      if (!allowed) continue;

      RSS(ref_subdiv_mark_to_split(ref_subdiv, node0, node1),
          "mark edge to para split");
    }

    RSS(ref_subdiv_split(ref_subdiv), "split");
    RSS(ref_subdiv_free(ref_subdiv), "free");

    {
      REF_INT n_cavity;
      n_cavity = ref_list_n(para_cavity);
      RSS(ref_mpi_allsum(ref_mpi, &n_cavity, 1, REF_INT_TYPE), "cavs");
      if (ref_mpi_once(ref_mpi))
        printf("cavities with part constraints %d\n", n_cavity);
    }

    ref_list_free(para_no_geom);
    ref_list_free(para_cavity);
  }

  ref_edge_free(ref_edge);

  return REF_SUCCESS;
}